

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
::addAllOfGroup<char_const(&)[6]>
          (API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
           *this,char (*name) [6],bool required)

{
  byte in_CL;
  CmdLine *in_RSI;
  API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  ArgPtr *in_stack_00000028;
  CmdLine *in_stack_00000030;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> a;
  AllOfGroup *g;
  unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> group;
  pointer in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 required_00;
  unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> *this_00;
  char (*in_stack_ffffffffffffff58) [6];
  unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> *__u;
  AllOfGroup *in_stack_ffffffffffffff60;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_58;
  type local_48;
  undefined1 local_3d [36];
  byte local_19;
  
  required_00 = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  local_19 = in_CL & 1;
  operator_new(0x50);
  AllOfGroup::AllOfGroup<char_const(&)[6]>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(bool)required_00);
  this_00 = (unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> *)local_3d;
  Deleter<Args::ArgIface>::Deleter((Deleter<Args::ArgIface> *)this_00,true);
  __u = (unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> *)(local_3d + 0xd);
  std::unique_ptr<Args::AllOfGroup,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            (this_00,in_stack_ffffffffffffff48,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x173e23);
  local_48 = std::unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_>::operator*
                       (this_00);
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::AllOfGroup,Args::details::Deleter<Args::ArgIface>,void>(&local_58,__u);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00,
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff48);
  CmdLine::addArg(in_stack_00000030,in_stack_00000028);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  ::API(in_RDI,in_RSI,local_48);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  return in_RDI;
}

Assistant:

API< PARENT, AllOfGroup, ARGPTR, false > addAllOfGroup(
		//! Name of the group.
		NAME && name,
		//! Is group required?
		bool required = false )
	{
		auto group = std::unique_ptr< AllOfGroup, details::Deleter< ArgIface > > (
			new AllOfGroup( std::forward< NAME > ( name ), required ),
			details::Deleter< ArgIface > ( true ) );

		AllOfGroup & g = *group;

		ARGPTR a = std::move( group );

		m_self.addArg( std::move( a ) );

		return API< PARENT, AllOfGroup, ARGPTR, false >
			( *( static_cast< PARENT* > ( this ) ), g );
	}